

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O1

uint32_t cpu_rddsp_mips(uint32_t mask_num,CPUMIPSState_conflict *env)

{
  uint32_t ruler;
  uint uVar1;
  uint32_t i;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint8_t mask [6];
  
  ruler = 1;
  lVar2 = 0;
  do {
    mask[lVar2] = (uint8_t)((ruler & mask_num) >> ((byte)lVar2 & 0x1f));
    ruler = ruler * 2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  uVar1 = (env->active_tc).DSPControl;
  uVar3 = uVar1 & 0x3f;
  if (mask[0] != '\x01') {
    uVar3 = 0;
  }
  uVar6 = uVar1 & 0x1f80;
  if (mask[1] != '\x01') {
    uVar6 = 0;
  }
  uVar4 = uVar1 & 0x2000;
  if (mask[2] != '\x01') {
    uVar4 = 0;
  }
  uVar7 = uVar1 & 0xff0000;
  if (mask[3] != '\x01') {
    uVar7 = 0;
  }
  uVar5 = uVar1 & 0xf000000;
  if (mask[4] != '\x01') {
    uVar5 = 0;
  }
  uVar1 = uVar1 & 0x4000;
  if (mask[5] != '\x01') {
    uVar1 = 0;
  }
  return uVar1 | uVar5 | uVar7 | uVar4 | uVar6 | uVar3;
}

Assistant:

uint32_t cpu_rddsp(uint32_t mask_num, CPUMIPSState *env)
{
    uint8_t  mask[6];
    uint32_t ruler, i;
    target_ulong temp;
    target_ulong dsp;

    ruler = 0x01;
    for (i = 0; i < 6; i++) {
        mask[i] = (mask_num & ruler) >> i ;
        ruler = ruler << 1;
    }

    temp  = 0x00;
    dsp = env->active_tc.DSPControl;

    if (mask[0] == 1) {
#if defined(TARGET_MIPS64)
        temp |= dsp & 0x7F;
#else
        temp |= dsp & 0x3F;
#endif
    }

    if (mask[1] == 1) {
        temp |= dsp & 0x1F80;
    }

    if (mask[2] == 1) {
        temp |= dsp & 0x2000;
    }

    if (mask[3] == 1) {
        temp |= dsp & 0x00FF0000;
    }

    if (mask[4] == 1) {
#if defined(TARGET_MIPS64)
        temp |= dsp & 0xFF000000;
#else
        temp |= dsp & 0x0F000000;
#endif
    }

    if (mask[5] == 1) {
        temp |= dsp & 0x4000;
    }

    return temp;
}